

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree_star_simplex_iterators.h
# Opt level: O3

void __thiscall
Gudhi::
Simplex_tree_optimized_cofaces_rooted_subtrees_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>
::Simplex_tree_optimized_cofaces_rooted_subtrees_simplex_iterator
          (Simplex_tree_optimized_cofaces_rooted_subtrees_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>
           *this,Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *cpx,
          Static_vertex_vector *simp)

{
  Static_vertex_vector *__dest;
  stored_size_type *psVar1;
  ulong uVar2;
  Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *pSVar3;
  list_node<void_*> *plVar4;
  stored_size_type sVar5;
  const_iterator cVar6;
  runtime_error *this_00;
  code *pcVar7;
  undefined *puVar8;
  iiterator_members<boost::intrusive::list_node<void_*>_*,_const_boost::intrusive::mhtraits<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>_*,_false>
  iVar9;
  iiterator_members<boost::intrusive::list_node<void_*>_*,_const_boost::intrusive::mhtraits<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>_*,_false>
  iVar10;
  list_iterator<boost::intrusive::mhtraits<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>,_true>
  local_2f8;
  list_iterator<boost::intrusive::mhtraits<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>,_true>
  local_2f0;
  is_coface local_2e8;
  filter_iterator<Gudhi::Simplex_tree_optimized_cofaces_rooted_subtrees_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>::is_coface,_boost::intrusive::list_iterator<boost::intrusive::mhtraits<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>,_true>_>
  local_238;
  undefined1 local_178 [160];
  ulong local_d8;
  undefined1 local_d0 [160];
  ulong local_30;
  
  (this->predicate_).cpx_ = cpx;
  uVar2 = (simp->
          super_vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>
          ).m_holder.m_size;
  (this->predicate_).simp_.
  super_vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>.
  m_holder.m_size = uVar2;
  if (0x28 < uVar2) {
    boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>::on_capacity_overflow();
  }
  __dest = &(this->predicate_).simp_;
  if (uVar2 != 0) {
    memmove(__dest,simp,uVar2 << 2);
  }
  this->st_ = cpx;
  (this->it_).super_type.m_iterator.members_.nodeptr_ = (list_node<void_*> *)0x0;
  (this->it_).m_predicate.cpx_ = (Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *)0x0;
  (this->it_).m_predicate.simp_.
  super_vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>.
  m_holder.m_size = 0;
  (this->it_).m_end.members_.nodeptr_ = (list_node<void_*> *)0x0;
  (this->end_).super_type.m_iterator.members_.nodeptr_ = (list_node<void_*> *)0x0;
  (this->end_).m_predicate.cpx_ = (Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *)0x0;
  (this->end_).m_predicate.simp_.
  super_vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>.
  m_holder.m_size = 0;
  (this->end_).m_end.members_.nodeptr_ = (list_node<void_*> *)0x0;
  (this->sh_).m_iit.members_.nodeptr_ = (compact_rbtree_node<void_*> *)0x0;
  if ((simp->
      super_vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>
      ).m_holder.m_size == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              ((invalid_argument *)this_00,"cannot call for cofaces of an empty simplex");
    puVar8 = &std::invalid_argument::typeinfo;
    pcVar7 = std::invalid_argument::~invalid_argument;
  }
  else {
    local_238.super_type.m_iterator.members_.nodeptr_._0_4_ =
         *(undefined4 *)
          &(simp->
           super_vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>
           ).m_holder.super_static_storage_allocator<int,_40UL,_0UL,_true>.storage;
    cVar6 = std::
            _Hashtable<int,_std::pair<const_int,_boost::intrusive::list<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::member_hook<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>,_boost::intrusive::constant_time_size<false>_>_>,_std::allocator<std::pair<const_int,_boost::intrusive::list<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::member_hook<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>,_boost::intrusive::constant_time_size<false>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<int,_std::pair<const_int,_boost::intrusive::list<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::member_hook<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>,_boost::intrusive::constant_time_size<false>_>_>,_std::allocator<std::pair<const_int,_boost::intrusive::list<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::member_hook<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>,_boost::intrusive::constant_time_size<false>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)cpx,(key_type *)&local_238);
    if (cVar6.
        super__Node_iterator_base<std::pair<const_int,_boost::intrusive::list<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::member_hook<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>,_boost::intrusive::constant_time_size<false>_>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      local_2e8.cpx_ = (this->predicate_).cpx_;
      local_30 = (this->predicate_).simp_.
                 super_vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>
                 .m_holder.m_size;
      if (0x28 < local_30) {
        boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>::on_capacity_overflow
                  ();
      }
      iVar10.nodeptr_ =
           (list_node<void_*> *)
           ((long)cVar6.
                  super__Node_iterator_base<std::pair<const_int,_boost::intrusive::list<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::member_hook<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>,_boost::intrusive::constant_time_size<false>_>_>,_false>
                  ._M_cur + 0x10);
      if (local_30 == 0) {
        iVar9.nodeptr_ = (iVar10.nodeptr_)->next_;
        local_2e8.simp_.
        super_vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>
        .m_holder.m_size = 0;
      }
      else {
        memcpy(local_d0,__dest,local_30 << 2);
        iVar9.nodeptr_ = (iVar10.nodeptr_)->next_;
        local_2e8.simp_.
        super_vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>
        .m_holder.m_size = local_30;
        if (0x28 < local_30) {
          boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>::
          on_capacity_overflow();
        }
        if (local_30 != 0) {
          memcpy(&local_2e8.simp_,local_d0,local_30 << 2);
        }
      }
      local_2f8.members_.nodeptr_ =
           (iiterator_members<boost::intrusive::list_node<void_*>_*,_const_boost::intrusive::mhtraits<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>_*,_false>
            )(iiterator_members<boost::intrusive::list_node<void_*>_*,_const_boost::intrusive::mhtraits<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>_*,_false>
              )iVar10.nodeptr_;
      local_2f0.members_.nodeptr_ =
           (iiterator_members<boost::intrusive::list_node<void_*>_*,_const_boost::intrusive::mhtraits<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>_*,_false>
            )(iiterator_members<boost::intrusive::list_node<void_*>_*,_const_boost::intrusive::mhtraits<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>_*,_false>
              )iVar9.nodeptr_;
      boost::iterators::
      filter_iterator<Gudhi::Simplex_tree_optimized_cofaces_rooted_subtrees_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>::is_coface,_boost::intrusive::list_iterator<boost::intrusive::mhtraits<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>,_true>_>
      ::filter_iterator(&local_238,&local_2e8,&local_2f0,&local_2f8);
      sVar5 = local_238.m_predicate.simp_.
              super_vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>
              .m_holder.m_size;
      *(undefined4 *)&(this->it_).super_type.m_iterator.members_.nodeptr_ =
           local_238.super_type.m_iterator.members_.nodeptr_._0_4_;
      *(undefined4 *)((long)&(this->it_).super_type.m_iterator.members_.nodeptr_ + 4) =
           local_238.super_type.m_iterator.members_.nodeptr_._4_4_;
      *(undefined4 *)&(this->it_).m_predicate.cpx_ = local_238.m_predicate.cpx_._0_4_;
      *(undefined4 *)((long)&(this->it_).m_predicate.cpx_ + 4) = local_238.m_predicate.cpx_._4_4_;
      if (&local_238 != &this->it_) {
        psVar1 = &(this->it_).m_predicate.simp_.
                  super_vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>
                  .m_holder.m_size;
        if (*psVar1 < local_238.m_predicate.simp_.
                      super_vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>
                      .m_holder.m_size) {
          Gudhi::Simplex_tree_optimized_cofaces_rooted_subtrees_simplex_iterator();
        }
        else if (local_238.m_predicate.simp_.
                 super_vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>
                 .m_holder.m_size != 0) {
          memcpy(&(this->it_).m_predicate.simp_,&local_238.m_predicate.simp_,
                 local_238.m_predicate.simp_.
                 super_vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>
                 .m_holder.m_size * 4);
        }
        *psVar1 = sVar5;
      }
      (this->it_).m_end.members_.nodeptr_ = (list_node<void_*> *)local_238.m_end.members_.nodeptr_;
      pSVar3 = (this->predicate_).cpx_;
      local_d8 = (this->predicate_).simp_.
                 super_vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>
                 .m_holder.m_size;
      if (0x28 < local_d8) {
        boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>::on_capacity_overflow
                  ();
      }
      if (local_d8 == 0) {
        local_2e8.simp_.
        super_vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>
        .m_holder.m_size = 0;
        local_2e8.cpx_ = pSVar3;
      }
      else {
        memcpy(local_178,__dest,local_d8 << 2);
        local_2e8.simp_.
        super_vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>
        .m_holder.m_size = local_d8;
        if (0x28 < local_d8) {
          local_2e8.cpx_ = pSVar3;
          boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>::
          on_capacity_overflow();
        }
        local_2e8.cpx_ = pSVar3;
        if (local_d8 != 0) {
          memcpy(&local_2e8.simp_,local_178,local_d8 << 2);
        }
      }
      local_2f8.members_.nodeptr_ =
           (iiterator_members<boost::intrusive::list_node<void_*>_*,_const_boost::intrusive::mhtraits<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>_*,_false>
            )(iiterator_members<boost::intrusive::list_node<void_*>_*,_const_boost::intrusive::mhtraits<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>_*,_false>
              )iVar10.nodeptr_;
      local_2f0.members_.nodeptr_ =
           (iiterator_members<boost::intrusive::list_node<void_*>_*,_const_boost::intrusive::mhtraits<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>_*,_false>
            )(iiterator_members<boost::intrusive::list_node<void_*>_*,_const_boost::intrusive::mhtraits<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>_*,_false>
              )iVar10.nodeptr_;
      boost::iterators::
      filter_iterator<Gudhi::Simplex_tree_optimized_cofaces_rooted_subtrees_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>_>::is_coface,_boost::intrusive::list_iterator<boost::intrusive::mhtraits<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>,_true>_>
      ::filter_iterator(&local_238,&local_2e8,&local_2f0,&local_2f8);
      (this->end_).super_type.m_iterator.members_.nodeptr_ =
           (list_node<void_*> *)
           CONCAT44(local_238.super_type.m_iterator.members_.nodeptr_._4_4_,
                    local_238.super_type.m_iterator.members_.nodeptr_._0_4_);
      (this->end_).m_predicate.cpx_ =
           (Simplex_tree<Gudhi::Simplex_tree_options_full_featured> *)
           CONCAT44(local_238.m_predicate.cpx_._4_4_,local_238.m_predicate.cpx_._0_4_);
      if (&local_238 != &this->end_) {
        psVar1 = &(this->end_).m_predicate.simp_.
                  super_vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>
                  .m_holder.m_size;
        if (*psVar1 < local_238.m_predicate.simp_.
                      super_vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>
                      .m_holder.m_size) {
          Gudhi::Simplex_tree_optimized_cofaces_rooted_subtrees_simplex_iterator();
        }
        else if (local_238.m_predicate.simp_.
                 super_vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>
                 .m_holder.m_size != 0) {
          memcpy(&(this->end_).m_predicate.simp_,&local_238.m_predicate.simp_,
                 local_238.m_predicate.simp_.
                 super_vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>
                 .m_holder.m_size * 4);
        }
        *psVar1 = local_238.m_predicate.simp_.
                  super_vector<int,_boost::container::dtl::static_storage_allocator<int,_40UL,_0UL,_true>,_void>
                  .m_holder.m_size;
      }
      (this->end_).m_end.members_.nodeptr_ = (list_node<void_*> *)local_238.m_end.members_.nodeptr_;
      plVar4 = (this->it_).super_type.m_iterator.members_.nodeptr_;
      if (plVar4[1].next_[2].next_ != (node_ptr)0x0) {
        (this->sh_).m_iit.members_.nodeptr_ = (compact_rbtree_node<void_*> *)(plVar4 + -3);
        return;
      }
      __assert_fail("!!p","/usr/include/boost/intrusive/detail/hook_traits.hpp",0x3e,
                    "static pointer boost::intrusive::bhtraits_base<boost::container::dtl::tree_node<std::pair<const int, Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>>>, void *, boost::container::red_black_tree, true>, boost::intrusive::compact_rbtree_node<void *> *, boost::intrusive::dft_tag, 3>::to_value_ptr(const node_ptr &) [T = boost::container::dtl::tree_node<std::pair<const int, Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_full_featured>>>, void *, boost::container::red_black_tree, true>, NodePtr = boost::intrusive::compact_rbtree_node<void *> *, Tag = boost::intrusive::dft_tag, Type = 3]"
                   );
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"invalid call to cofaces forest");
    puVar8 = &std::runtime_error::typeinfo;
    pcVar7 = std::runtime_error::~runtime_error;
  }
  __cxa_throw(this_00,puVar8,pcVar7);
}

Assistant:

Simplex_tree_optimized_cofaces_rooted_subtrees_simplex_iterator(SimplexTree const* cpx,
                                                                  Static_vertex_vector&& simp)
      : predicate_(cpx, std::move(simp)), st_(cpx) {
    GUDHI_CHECK(!simp.empty(), std::invalid_argument("cannot call for cofaces of an empty simplex"));
    const auto list_ptr = st_->nodes_by_label(simp.front());
    GUDHI_CHECK(list_ptr != nullptr, std::runtime_error("invalid call to cofaces forest"));

    it_ = boost::make_filter_iterator(predicate_, list_ptr->begin(), list_ptr->end());
    end_ = boost::make_filter_iterator(predicate_, list_ptr->end(), list_ptr->end());
    const Node& curr_node = static_cast<const Node&>(*it_);
    sh_ = st_->simplex_handle_from_node(curr_node);
  }